

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
* tinyusdz::tydra::GetBlendShapes
            (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
             *__return_storage_ptr__,Stage *stage,Prim *prim,string *err)

{
  Path *pPVar1;
  bool bVar2;
  GeomMesh *pGVar3;
  value_type *pvVar4;
  size_type sVar5;
  size_type sVar6;
  Path *pPVar7;
  reference pvVar8;
  string *psVar9;
  string local_1c0;
  allocator local_199;
  string local_198 [32];
  fmt local_178 [32];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>
  local_158;
  BlendShape *local_130;
  BlendShape *bs_1;
  Prim *bsprim_1;
  Path *targetPath_1;
  size_t i;
  allocator local_e9;
  string local_e8 [32];
  fmt local_c8 [32];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>
  local_a8;
  BlendShape *local_80;
  BlendShape *bs;
  Prim *bsprim;
  Path *targetPath;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> blendShapeNames;
  GeomMesh *pmesh;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
  dst;
  string *err_local;
  Prim *prim_local;
  Stage *stage_local;
  
  dst.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)err;
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
            *)&pmesh);
  pGVar3 = Prim::as<tinyusdz::GeomMesh>(prim);
  if (pGVar3 == (GeomMesh *)0x0) {
    if (dst.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      ::std::__cxx11::string::operator+=
                ((string *)
                 dst.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,"Prim must be GeomMesh.\n");
    }
    memset(__return_storage_ptr__,0,0x18);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    ::vector(__return_storage_ptr__);
    blendShapeNames.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    goto LAB_004ac0a1;
  }
  bVar2 = TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::authored
                    (&pGVar3->blendShapes);
  if ((bVar2) &&
     (bVar2 = nonstd::optional_lite::optional<tinyusdz::Relationship>::has_value
                        (&pGVar3->blendShapeTargets), bVar2)) {
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&targetPath);
    bVar2 = TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::
            get_value(&pGVar3->blendShapes,
                      (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&targetPath);
    if (bVar2) {
      pvVar4 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                         (&pGVar3->blendShapeTargets);
      bVar2 = Relationship::is_path(pvVar4);
      if (bVar2) {
        sVar5 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                          ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&targetPath)
        ;
        if (sVar5 == 1) {
          pvVar4 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                             (&pGVar3->blendShapeTargets);
          bsprim = (Prim *)&pvVar4->targetPath;
          bs = (BlendShape *)0x0;
          bVar2 = Stage::find_prim_at_path
                            (stage,(Path *)bsprim,(Prim **)&bs,
                             &(dst.
                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->first);
          if (bVar2) {
            if (bs == (BlendShape *)0x0) {
              if (dst.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                ::std::__cxx11::string::operator+=
                          ((string *)
                           dst.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           "Internal error. BlendShape Prim is nullptr.\n");
              }
              memset(__return_storage_ptr__,0,0x18);
              ::std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
              ::vector(__return_storage_ptr__);
              blendShapeNames.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
            }
            else {
              local_80 = Prim::as<tinyusdz::BlendShape>((Prim *)bs);
              if (local_80 != (BlendShape *)0x0) {
                pvVar8 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
                         operator[]((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                    &targetPath,0);
                psVar9 = Token::str_abi_cxx11_(pvVar8);
                ::std::make_pair<std::__cxx11::string_const&,tinyusdz::BlendShape_const*&>
                          (&local_a8,psVar9,&local_80);
                ::std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                             *)&pmesh,&local_a8);
                ::std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>
                ::~pair(&local_a8);
                goto LAB_004abe0e;
              }
              if (dst.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string(local_e8,"{} is not BlendShape Prim.\n",&local_e9);
                Path::full_path_name_abi_cxx11_((string *)&i,&bsprim->_abs_path);
                fmt::format<std::__cxx11::string>
                          (local_c8,(string *)local_e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
                ::std::__cxx11::string::operator+=
                          ((string *)
                           dst.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_c8);
                ::std::__cxx11::string::~string((string *)local_c8);
                ::std::__cxx11::string::~string((string *)&i);
                ::std::__cxx11::string::~string(local_e8);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_e9);
              }
              memset(__return_storage_ptr__,0,0x18);
              ::std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
              ::vector(__return_storage_ptr__);
              blendShapeNames.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
            }
          }
          else {
            memset(__return_storage_ptr__,0,0x18);
            ::std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
            ::vector(__return_storage_ptr__);
            blendShapeNames.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
          }
        }
        else {
          if (dst.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            ::std::__cxx11::string::operator+=
                      ((string *)
                       dst.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       "Array size mismatch with `skel:blendShapes` and `skel:blendShapeTargets`.\n"
                      );
          }
          memset(__return_storage_ptr__,0,0x18);
          ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
          ::vector(__return_storage_ptr__);
          blendShapeNames.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
        }
      }
      else {
        pvVar4 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                           (&pGVar3->blendShapeTargets);
        bVar2 = Relationship::is_pathvector(pvVar4);
        if (bVar2) {
          sVar5 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                             &targetPath);
          pvVar4 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                             (&pGVar3->blendShapeTargets);
          sVar6 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                            (&pvVar4->targetPathVector);
          if (sVar5 == sVar6) {
LAB_004abe0e:
            targetPath_1 = (Path *)0x0;
            while( true ) {
              pPVar1 = targetPath_1;
              pvVar4 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                                 (&pGVar3->blendShapeTargets);
              pPVar7 = (Path *)::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                                         (&pvVar4->targetPathVector);
              if (pPVar7 <= pPVar1) break;
              pvVar4 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                                 (&pGVar3->blendShapeTargets);
              bsprim_1 = (Prim *)::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::
                                 operator[](&pvVar4->targetPathVector,(size_type)targetPath_1);
              bs_1 = (BlendShape *)0x0;
              bVar2 = Stage::find_prim_at_path
                                (stage,(Path *)bsprim_1,(Prim **)&bs_1,
                                 &(dst.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->first);
              if (!bVar2) {
                memset(__return_storage_ptr__,0,0x18);
                ::std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                ::vector(__return_storage_ptr__);
                blendShapeNames.
                super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
                goto LAB_004ac076;
              }
              if (bs_1 == (BlendShape *)0x0) {
                if (dst.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                  ::std::__cxx11::string::operator+=
                            ((string *)
                             dst.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             "Internal error. BlendShape Prim is nullptr.");
                }
                memset(__return_storage_ptr__,0,0x18);
                ::std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                ::vector(__return_storage_ptr__);
                blendShapeNames.
                super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
                goto LAB_004ac076;
              }
              local_130 = Prim::as<tinyusdz::BlendShape>((Prim *)bs_1);
              if (local_130 == (BlendShape *)0x0) {
                if (dst.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string(local_198,"{} is not BlendShape Prim.",&local_199);
                  Path::full_path_name_abi_cxx11_(&local_1c0,&bsprim_1->_abs_path);
                  fmt::format<std::__cxx11::string>
                            (local_178,(string *)local_198,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_1c0);
                  ::std::__cxx11::string::operator+=
                            ((string *)
                             dst.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_178)
                  ;
                  ::std::__cxx11::string::~string((string *)local_178);
                  ::std::__cxx11::string::~string((string *)&local_1c0);
                  ::std::__cxx11::string::~string(local_198);
                  ::std::allocator<char>::~allocator((allocator<char> *)&local_199);
                }
                memset(__return_storage_ptr__,0,0x18);
                ::std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                ::vector(__return_storage_ptr__);
                blendShapeNames.
                super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
                goto LAB_004ac076;
              }
              pvVar8 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator[]
                                 ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                  &targetPath,0);
              psVar9 = Token::str_abi_cxx11_(pvVar8);
              ::std::make_pair<std::__cxx11::string_const&,tinyusdz::BlendShape_const*&>
                        (&local_158,psVar9,&local_130);
              ::std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
              ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                           *)&pmesh,&local_158);
              ::std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>
              ::~pair(&local_158);
              targetPath_1 = (Path *)&(targetPath_1->_prim_part).field_0x1;
            }
            blendShapeNames.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          }
          else {
            if (dst.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
              ::std::__cxx11::string::operator+=
                        ((string *)
                         dst.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         "Array size mismatch with `skel:blendShapes` and `skel:blendShapeTargets`.\n"
                        );
            }
            memset(__return_storage_ptr__,0,0x18);
            ::std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
            ::vector(__return_storage_ptr__);
            blendShapeNames.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
          }
        }
        else {
          if (dst.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            ::std::__cxx11::string::operator+=
                      ((string *)
                       dst.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       "Invalid or unsupported definition of `skel:blendShapeTargets` relationship.\n"
                      );
          }
          memset(__return_storage_ptr__,0,0x18);
          ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
          ::vector(__return_storage_ptr__);
          blendShapeNames.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
        }
      }
    }
    else {
      if (dst.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        ::std::__cxx11::string::operator+=
                  ((string *)
                   dst.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   "Failed to get `skel:blendShapes` attribute.\n");
      }
      memset(__return_storage_ptr__,0,0x18);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
      ::vector(__return_storage_ptr__);
      blendShapeNames.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
LAB_004ac076:
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&targetPath);
    if (blendShapeNames.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) goto LAB_004ac0a1;
  }
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
  ::vector(__return_storage_ptr__,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
            *)&pmesh);
  blendShapeNames.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
LAB_004ac0a1:
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
             *)&pmesh);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<std::string, const tinyusdz::BlendShape *>>
GetBlendShapes(const tinyusdz::Stage &stage, const tinyusdz::Prim &prim,
               std::string *err) {
  std::vector<std::pair<std::string, const tinyusdz::BlendShape *>> dst;

  auto *pmesh = prim.as<GeomMesh>();
  if (!pmesh) {
    if (err) {
      (*err) += "Prim must be GeomMesh.\n";
    }
    return std::vector<std::pair<std::string, const tinyusdz::BlendShape *>>{};
  }

  //
  // BlendShape Prim may not be a child of GeomMesh. So need to search Prim in
  // Stage
  //
  if (pmesh->blendShapes.authored() && pmesh->blendShapeTargets.has_value()) {
    // TODO: connection?
    std::vector<value::token> blendShapeNames;

    if (!pmesh->blendShapes.get_value(&blendShapeNames)) {
      if (err) {
        (*err) += "Failed to get `skel:blendShapes` attribute.\n";
      }
      return std::vector<
          std::pair<std::string, const tinyusdz::BlendShape *>>{};
    }

    if (pmesh->blendShapeTargets.value().is_path()) {
      if (blendShapeNames.size() != 1) {
        if (err) {
          (*err) +=
              "Array size mismatch with `skel:blendShapes` and "
              "`skel:blendShapeTargets`.\n";
        }
        return std::vector<
            std::pair<std::string, const tinyusdz::BlendShape *>>{};
      }

      const Path &targetPath = pmesh->blendShapeTargets.value().targetPath;
      const Prim *bsprim{nullptr};
      if (!stage.find_prim_at_path(targetPath, bsprim, err)) {
        return std::vector<
            std::pair<std::string, const tinyusdz::BlendShape *>>{};
      }
      if (!bsprim) {
        if (err) {
          (*err) += "Internal error. BlendShape Prim is nullptr.\n";
        }
        return std::vector<
            std::pair<std::string, const tinyusdz::BlendShape *>>{};
      }

      if (const auto *bs = bsprim->as<BlendShape>()) {
        dst.push_back(std::make_pair(blendShapeNames[0].str(), bs));
      } else {
        if (err) {
          (*err) += fmt::format("{} is not BlendShape Prim.\n",
                                targetPath.full_path_name());
        }
        return std::vector<
            std::pair<std::string, const tinyusdz::BlendShape *>>{};
      }

    } else if (pmesh->blendShapeTargets.value().is_pathvector()) {
      if (blendShapeNames.size() !=
          pmesh->blendShapeTargets.value().targetPathVector.size()) {
        if (err) {
          (*err) +=
              "Array size mismatch with `skel:blendShapes` and "
              "`skel:blendShapeTargets`.\n";
        }
        return std::vector<
            std::pair<std::string, const tinyusdz::BlendShape *>>{};
      }
    } else {
      if (err) {
        (*err) +=
            "Invalid or unsupported definition of `skel:blendShapeTargets` "
            "relationship.\n";
      }
      return std::vector<
          std::pair<std::string, const tinyusdz::BlendShape *>>{};
    }

    for (size_t i = 0;
         i < pmesh->blendShapeTargets.value().targetPathVector.size(); i++) {
      const Path &targetPath =
          pmesh->blendShapeTargets.value().targetPathVector[i];
      const Prim *bsprim{nullptr};
      if (!stage.find_prim_at_path(targetPath, bsprim, err)) {
        return std::vector<
            std::pair<std::string, const tinyusdz::BlendShape *>>{};
      }
      if (!bsprim) {
        if (err) {
          (*err) += "Internal error. BlendShape Prim is nullptr.";
        }
        return std::vector<
            std::pair<std::string, const tinyusdz::BlendShape *>>{};
      }

      if (const auto *bs = bsprim->as<BlendShape>()) {
        dst.push_back(std::make_pair(blendShapeNames[0].str(), bs));
      } else {
        if (err) {
          (*err) += fmt::format("{} is not BlendShape Prim.",
                                targetPath.full_path_name());
        }
        return std::vector<
            std::pair<std::string, const tinyusdz::BlendShape *>>{};
      }
    }
  }

  return dst;
}